

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_resume_data.cpp
# Opt level: O1

add_torrent_params *
libtorrent::read_resume_data
          (add_torrent_params *__return_storage_ptr__,bdecode_node *rd,error_code *ec,
          int piece_limit)

{
  byte *pbVar1;
  sha256_hash *this;
  pointer *ppvVar2;
  torrent_flags_t *current_flags;
  vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
  *this_00;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *this_01;
  pointer *ppbVar3;
  uint *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  iterator __position;
  pointer pvVar5;
  pointer pbVar6;
  iterator __position_00;
  _Head_base<0UL,_unsigned_int_*,_false> _Var7;
  tuple<unsigned_int_*,_std::default_delete<unsigned_int[]>_> tVar8;
  iterator iVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  void *pvVar13;
  undefined1 auVar14 [16];
  pointer pbVar15;
  bool bVar16;
  byte bVar17;
  type_t tVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  pointer pbVar23;
  int64_t iVar24;
  mapped_type *pmVar25;
  char *pcVar26;
  pointer psVar27;
  mapped_type *this_03;
  storage_mode_t sVar28;
  size_t sVar29;
  char **in;
  char **in_00;
  char **in_01;
  char **in_02;
  int j;
  int i_4;
  long lVar31;
  int i_1;
  int i;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view key_08;
  string_view key_09;
  string_view key_10;
  string_view key_11;
  string_view key_12;
  string_view key_13;
  string_view key_14;
  string_view key_15;
  string_view key_16;
  string_view key_17;
  string_view key_18;
  string_view key_19;
  string_view key_20;
  string_view key_21;
  string_view key_22;
  string_view key_23;
  string_view sVar37;
  error_code eVar38;
  string_view sVar39;
  string_view sVar40;
  span<const_char> sVar41;
  error_code eVar42;
  string_view key_24;
  string_view key_25;
  string_view key_26;
  string_view key_27;
  string_view key_28;
  string_view key_29;
  string_view key_30;
  string_view key_31;
  string_view key_32;
  string_view key_33;
  string_view key_34;
  string_view key_35;
  string_view key_36;
  string_view key_37;
  string_view key_38;
  string_view key_39;
  string_view key_40;
  string_view key_41;
  string_view url;
  piece_index_t piece;
  bdecode_node mapped_files;
  bdecode_node file_priority;
  bdecode_node trees;
  bdecode_node trackers;
  int tier;
  bdecode_node url_list;
  bdecode_node info;
  char *ptr;
  bdecode_node local_2e0;
  vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>> *local_2a0;
  int64_t local_298;
  key_type local_28c;
  bdecode_node local_288;
  vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>> *local_240;
  bdecode_node local_238;
  bdecode_node local_1f8;
  string_view local_1b0;
  pointer local_1a0;
  data_union local_170 [2];
  bdecode_node local_130;
  bdecode_node local_f0;
  vector<std::vector<sha256_hash>,_file_index_t> *local_b0;
  pointer local_a8;
  pointer pbStack_a0;
  uint local_98;
  bdecode_node local_90;
  sha256_hash local_50;
  char *pcVar30;
  
  add_torrent_params::add_torrent_params(__return_storage_ptr__);
  tVar18 = bdecode_node::type(rd);
  if (tVar18 != dict_t) {
    eVar38 = errors::make_error_code(not_a_dictionary);
LAB_002a242d:
    *ec = eVar38;
    return __return_storage_ptr__;
  }
  sVar37._M_str = "allocation";
  sVar37._M_len = 10;
  bdecode_node::dict_find_string(&local_f0,rd,sVar37);
  bVar16 = bdecode_node::operator_cast_to_bool(&local_f0);
  if (bVar16) {
    sVar37 = bdecode_node::string_value(&local_f0);
    if ((sVar37._M_len == 8) && (iVar19 = bcmp(sVar37._M_str,"allocate",8), iVar19 == 0)) {
      sVar28 = storage_mode_allocate;
    }
    else {
      sVar37 = bdecode_node::string_value(&local_f0);
      sVar28 = storage_mode_sparse;
      if (sVar37._M_len == 4) {
        iVar19 = bcmp(sVar37._M_str,"full",4);
        sVar28 = (storage_mode_t)(iVar19 != 0);
      }
    }
    __return_storage_ptr__->storage_mode = sVar28;
  }
  if (local_f0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  sVar39._M_str = "file-format";
  sVar39._M_len = 0xb;
  sVar37 = bdecode_node::dict_find_string_value(rd,sVar39,(string_view)ZEXT816(0));
  if ((sVar37._M_len != 0x16) ||
     (iVar19 = bcmp(sVar37._M_str,"libtorrent resume file",0x16), iVar19 != 0)) {
    eVar38 = errors::make_error_code(invalid_file_tag);
    goto LAB_002a242d;
  }
  sVar40._M_str = "file-version";
  sVar40._M_len = 0xc;
  local_298 = bdecode_node::dict_find_int_value(rd,sVar40,1);
  if (local_298 - 3U < 0xfffffffffffffffe) {
    eVar38 = errors::make_error_code(invalid_file_tag);
    goto LAB_002a242d;
  }
  key._M_str = "info-hash";
  key._M_len = 9;
  sVar37 = bdecode_node::dict_find_string_value(rd,key,(string_view)ZEXT816(0));
  pcVar26 = sVar37._M_str;
  key_00._M_str = "info-hash2";
  key_00._M_len = 10;
  sVar39 = bdecode_node::dict_find_string_value(rd,key_00,(string_view)ZEXT816(0));
  pcVar30 = sVar39._M_str;
  if (sVar39._M_len != 0x20 && sVar37._M_len != 0x14) {
    eVar38 = errors::make_error_code(missing_info_hash);
    goto LAB_002a242d;
  }
  key_01._M_str = "name";
  key_01._M_len = 4;
  sVar40 = bdecode_node::dict_find_string_value(rd,key_01,(string_view)ZEXT816(0));
  ::std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->name,0,
             (char *)(__return_storage_ptr__->name)._M_string_length,(ulong)sVar40._M_str);
  if (sVar37._M_len == 0x14) {
    (__return_storage_ptr__->info_hashes).v1.m_number._M_elems[4] = *(uint *)(pcVar26 + 0x10);
    uVar10 = *(undefined8 *)(pcVar26 + 8);
    *(undefined8 *)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems =
         *(undefined8 *)pcVar26;
    *(undefined8 *)((__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 2) = uVar10;
  }
  if (sVar39._M_len == 0x20) {
    uVar10 = *(undefined8 *)pcVar30;
    uVar11 = *(undefined8 *)(pcVar30 + 8);
    uVar12 = *(undefined8 *)(pcVar30 + 0x18);
    *(undefined8 *)((__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 4) =
         *(undefined8 *)(pcVar30 + 0x10);
    *(undefined8 *)((__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 6) = uVar12;
    *(undefined8 *)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems = uVar10;
    *(undefined8 *)((__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 2) = uVar11;
  }
  key_24._M_str = "info";
  key_24._M_len = 4;
  bdecode_node::dict_find_dict(&local_f0,rd,key_24);
  bVar16 = bdecode_node::operator_cast_to_bool(&local_f0);
  if (!bVar16) goto LAB_002a282f;
  sVar41 = bdecode_node::data_section(&local_f0);
  lcrypto::hasher::hasher((hasher *)&local_288,sVar41);
  lcrypto::hasher::final((sha1_hash *)&local_a8,(hasher *)&local_288);
  sVar41 = bdecode_node::data_section(&local_f0);
  lcrypto::hasher256::hasher256((hasher256 *)&local_238,sVar41);
  lcrypto::hasher256::final(&local_50,(hasher256 *)&local_238);
  local_1f8.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_98;
  local_1f8.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = local_a8;
  local_1f8.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbStack_a0;
  local_1f8.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = (char)local_50.m_number._M_elems[0];
  local_1f8.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = local_50.m_number._M_elems[0]._1_1_;
  local_1f8.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = local_50.m_number._M_elems[0]._2_1_;
  local_1f8.m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_50.m_number._M_elems[0]._3_1_;
  local_1f8.m_root_tokens._0_1_ = (char)local_50.m_number._M_elems[1];
  local_1f8.m_root_tokens._1_1_ = local_50.m_number._M_elems[1]._1_1_;
  local_1f8.m_root_tokens._2_1_ = local_50.m_number._M_elems[1]._2_1_;
  local_1f8.m_root_tokens._3_1_ = local_50.m_number._M_elems[1]._3_1_;
  local_1f8._28_8_ = local_50.m_number._M_elems._8_8_;
  local_1f8._36_8_ = local_50.m_number._M_elems._16_8_;
  local_1f8.m_token_idx = local_50.m_number._M_elems[6];
  local_1f8.m_last_index = local_50.m_number._M_elems[7];
  lcrypto::hasher256::~hasher256((hasher256 *)&local_238);
  lcrypto::hasher::~hasher((hasher *)&local_288);
  bVar16 = digest32<160L>::is_all_zeros(&(__return_storage_ptr__->info_hashes).v1);
  if (bVar16) {
LAB_002a2687:
    bVar16 = digest32<256L>::is_all_zeros(&(__return_storage_ptr__->info_hashes).v2);
    if (!bVar16) {
      auVar36[0] = -(local_1f8.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ ==
                    (char)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems[0]);
      auVar36[1] = -(local_1f8.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 1))
      ;
      auVar36[2] = -(local_1f8.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 2))
      ;
      auVar36[3] = -(local_1f8.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 3))
      ;
      auVar36[4] = -((char)local_1f8.m_root_tokens ==
                    (char)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems[1]);
      auVar36[5] = -(local_1f8.m_root_tokens._1_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 5))
      ;
      auVar36[6] = -(local_1f8.m_root_tokens._2_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 6))
      ;
      auVar36[7] = -(local_1f8.m_root_tokens._3_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 7))
      ;
      auVar36[8] = -(local_1f8.m_root_tokens._4_1_ ==
                    (char)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems[2]);
      auVar36[9] = -(local_1f8.m_root_tokens._5_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 9))
      ;
      auVar36[10] = -(local_1f8.m_root_tokens._6_1_ ==
                     *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 10
                              ));
      auVar36[0xb] = -(local_1f8.m_root_tokens._7_1_ ==
                      *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                               0xb));
      auVar36[0xc] = -((char)local_1f8.m_buffer ==
                      (char)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems[3]);
      auVar36[0xd] = -(local_1f8.m_buffer._1_1_ ==
                      *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                               0xd));
      auVar36[0xe] = -(local_1f8.m_buffer._2_1_ ==
                      *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                               0xe));
      auVar36[0xf] = -(local_1f8.m_buffer._3_1_ ==
                      *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                               0xf));
      auVar34[0] = -(local_1f8.m_buffer._4_1_ ==
                    (char)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems[4]);
      auVar34[1] = -(local_1f8.m_buffer._5_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                             0x11));
      auVar34[2] = -(local_1f8.m_buffer._6_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                             0x12));
      auVar34[3] = -(local_1f8.m_buffer._7_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                             0x13));
      auVar34[4] = -((char)local_1f8.m_buffer_size ==
                    (char)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems[5]);
      auVar34[5] = -(local_1f8.m_buffer_size._1_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                             0x15));
      auVar34[6] = -(local_1f8.m_buffer_size._2_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                             0x16));
      auVar34[7] = -(local_1f8.m_buffer_size._3_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                             0x17));
      auVar34[8] = -((char)local_1f8.m_token_idx ==
                    (char)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems[6]);
      auVar34[9] = -(local_1f8.m_token_idx._1_1_ ==
                    *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                             0x19));
      auVar34[10] = -(local_1f8.m_token_idx._2_1_ ==
                     *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                              0x1a));
      auVar34[0xb] = -(local_1f8.m_token_idx._3_1_ ==
                      *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                               0x1b));
      auVar34[0xc] = -((char)local_1f8.m_last_index ==
                      (char)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems[7]);
      auVar34[0xd] = -(local_1f8.m_last_index._1_1_ ==
                      *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                               0x1d));
      auVar34[0xe] = -(local_1f8.m_last_index._2_1_ ==
                      *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                               0x1e));
      auVar34[0xf] = -(local_1f8.m_last_index._3_1_ ==
                      *(char *)((long)(__return_storage_ptr__->info_hashes).v2.m_number._M_elems +
                               0x1f));
      auVar34 = auVar34 & auVar36;
      if ((ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar34[0xf] >> 7) << 0xf) != 0xffff) goto LAB_002a26da;
    }
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         local_288.m_tokens.
         super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_288.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._0_16_ = auVar14 << 0x40;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<libtorrent::torrent_info,std::allocator<libtorrent::torrent_info>,libtorrent::info_hash_t_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_288 + 8),
               (torrent_info **)&local_288,(allocator<libtorrent::torrent_info> *)&local_238,
               (info_hash_t *)&local_1f8);
    local_238.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    local_238.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ =
         local_238.m_tokens.
         super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
         ._M_impl.super__Vector_impl_data._M_start._4_4_ & 0xffffff00;
    local_238.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)&boost::system::detail::cat_holder<void>::system_category_instance;
    bVar16 = torrent_info::parse_info_section
                       ((torrent_info *)
                        local_288.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start,&local_f0,(error_code *)&local_238
                        ,piece_limit);
    if (bVar16) {
      pbVar23 = local_288.m_tokens.
                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ._M_impl.super__Vector_impl_data._M_start;
      key_02._M_str = "creation date";
      key_02._M_len = 0xd;
      iVar24 = bdecode_node::dict_find_int_value(rd,key_02,0);
      torrent_info::internal_set_creation_date((torrent_info *)pbVar23,iVar24);
      pbVar23 = local_288.m_tokens.
                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ._M_impl.super__Vector_impl_data._M_start;
      key_03._M_str = "created by";
      key_03._M_len = 10;
      sVar37 = bdecode_node::dict_find_string_value
                         (rd,key_03,(string_view)(ZEXT816(0x3eda7b) << 0x40));
      torrent_info::internal_set_creator((torrent_info *)pbVar23,sVar37);
      pbVar23 = local_288.m_tokens.
                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ._M_impl.super__Vector_impl_data._M_start;
      key_04._M_str = "comment";
      key_04._M_len = 7;
      sVar37 = bdecode_node::dict_find_string_value
                         (rd,key_04,(string_view)(ZEXT816(0x3eda7b) << 0x40));
      torrent_info::internal_set_comment((torrent_info *)pbVar23,sVar37);
    }
    else {
      ec->val_ = (int)local_238.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start;
      ec->failed_ = (bool)(char)local_238.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_;
      *(int3 *)&ec->field_0x5 =
           (int3)(local_238.m_tokens.
                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_4_ >> 8);
      ec->cat_ = (error_category *)
                 local_238.m_tokens.
                 super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    }
    pbVar23 = local_288.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar15 = local_288.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_288.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_02 = (__return_storage_ptr__->ti).
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (__return_storage_ptr__->ti).
    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)pbVar23;
    (__return_storage_ptr__->ti).
    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar15;
    if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_288.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_288.m_tokens.
                 super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  else {
    uVar21 = (__return_storage_ptr__->info_hashes).v1.m_number._M_elems[4];
    auVar33[0] = -((char)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems[0] ==
                  (char)local_1f8.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    auVar33[1] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 1)
                  == local_1f8.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start._1_1_);
    auVar33[2] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 2)
                  == local_1f8.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start._2_1_);
    auVar33[3] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 3)
                  == local_1f8.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start._3_1_);
    auVar33[4] = -((char)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems[1] ==
                  local_1f8.m_tokens.
                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_1_);
    auVar33[5] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 5)
                  == local_1f8.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start._5_1_);
    auVar33[6] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 6)
                  == local_1f8.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start._6_1_);
    auVar33[7] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 7)
                  == local_1f8.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start._7_1_);
    auVar33[8] = -((char)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems[2] ==
                  (char)local_1f8.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    auVar33[9] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 9)
                  == local_1f8.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_finish._1_1_);
    auVar33[10] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 10)
                   == local_1f8.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_finish._2_1_);
    auVar33[0xb] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems +
                              0xb) ==
                    local_1f8.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_finish._3_1_);
    auVar33[0xc] = -((char)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems[3] ==
                    local_1f8.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_finish._4_1_);
    auVar33[0xd] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems +
                              0xd) ==
                    local_1f8.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_finish._5_1_);
    auVar33[0xe] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems +
                              0xe) ==
                    local_1f8.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_finish._6_1_);
    auVar33[0xf] = -(*(char *)((long)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems +
                              0xf) ==
                    local_1f8.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_finish._7_1_);
    auVar35[0] = -((char)(uint)local_1f8.m_tokens.
                               super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage == (char)uVar21);
    auVar35[1] = -((char)((uint)local_1f8.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage >> 8) ==
                  (char)(uVar21 >> 8));
    auVar35[2] = -((char)((uint)local_1f8.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x10) ==
                  (char)(uVar21 >> 0x10));
    auVar35[3] = -((char)((uint)local_1f8.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x18) ==
                  (char)(uVar21 >> 0x18));
    auVar35[4] = 0xff;
    auVar35[5] = 0xff;
    auVar35[6] = 0xff;
    auVar35[7] = 0xff;
    auVar35[8] = 0xff;
    auVar35[9] = 0xff;
    auVar35[10] = 0xff;
    auVar35[0xb] = 0xff;
    auVar35[0xc] = 0xff;
    auVar35[0xd] = 0xff;
    auVar35[0xe] = 0xff;
    auVar35[0xf] = 0xff;
    auVar33 = auVar33 & auVar35;
    if ((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) == 0xffff) goto LAB_002a2687;
LAB_002a26da:
    eVar42 = errors::make_error_code(mismatching_info_hash);
    ec->val_ = eVar42.val_;
    ec->failed_ = eVar42.failed_;
    *(int3 *)&ec->field_0x5 = eVar42._5_3_;
    ec->cat_ = eVar42.cat_;
  }
LAB_002a282f:
  this = &(__return_storage_ptr__->info_hashes).v2;
  bVar16 = digest32<256L>::is_all_zeros(this);
  if (bVar16) {
    local_1f8.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (__return_storage_ptr__->info_hashes).v1.m_number._M_elems[4];
    local_1f8.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_start =
         *(pointer *)(__return_storage_ptr__->info_hashes).v1.m_number._M_elems;
    local_1f8.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         *(pointer *)((__return_storage_ptr__->info_hashes).v1.m_number._M_elems + 2);
  }
  else {
    local_1f8.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         (__return_storage_ptr__->info_hashes).v2.m_number._M_elems[4];
    local_1f8.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(this->m_number)._M_elems;
    local_1f8.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         *(pointer *)((__return_storage_ptr__->info_hashes).v2.m_number._M_elems + 2);
  }
  (__return_storage_ptr__->info_hash).m_number._M_elems[4] =
       (uint)local_1f8.m_tokens.
             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  *(pointer *)(__return_storage_ptr__->info_hash).m_number._M_elems =
       local_1f8.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)((__return_storage_ptr__->info_hash).m_number._M_elems + 2) =
       local_1f8.m_tokens.
       super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  key_25._M_str = "trees";
  key_25._M_len = 5;
  bdecode_node::dict_find_list(&local_1f8,rd,key_25);
  bVar16 = bdecode_node::operator_cast_to_bool(&local_1f8);
  if (bVar16) {
    iVar19 = bdecode_node::list_size(&local_1f8);
    local_b0 = &__return_storage_ptr__->merkle_trees;
    ::std::
    vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
    ::reserve(&local_b0->
               super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
              ,(long)iVar19);
    iVar19 = bdecode_node::list_size(&local_1f8);
    local_2a0 = (vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>> *)
                &__return_storage_ptr__->verified_leaf_hashes;
    ::std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>::reserve
              ((vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_> *)local_2a0,
               (long)iVar19);
    local_240 = (vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>> *)
                &__return_storage_ptr__->merkle_tree_mask;
    for (iVar19 = 0; iVar20 = bdecode_node::list_size(&local_1f8), iVar19 < iVar20;
        iVar19 = iVar19 + 1) {
      bdecode_node::list_at(&local_288,&local_1f8,iVar19);
      tVar18 = bdecode_node::type(&local_288);
      if (tVar18 != dict_t) {
LAB_002a2c8c:
        if (local_288.m_tokens.
            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_288.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_288.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_288.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        break;
      }
      key_26._M_str = "hashes";
      key_26._M_len = 6;
      bdecode_node::dict_find_string(&local_238,&local_288,key_26);
      bVar16 = bdecode_node::operator_cast_to_bool(&local_238);
      if ((!bVar16) || (uVar21 = bdecode_node::string_length(&local_238), (uVar21 & 0x1f) != 0)) {
        pvVar13 = (void *)CONCAT44(local_238.m_tokens.
                                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (int)local_238.m_tokens.
                                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
        if (pvVar13 != (void *)0x0) {
          operator_delete(pvVar13,(long)local_238.m_tokens.
                                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pvVar13);
        }
        goto LAB_002a2c8c;
      }
      __position._M_current =
           (__return_storage_ptr__->merkle_trees).
           super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
           .
           super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->merkle_trees).
          super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
          .
          super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
        ::_M_realloc_insert<>
                  (&local_b0->
                    super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                   ,__position);
      }
      else {
        ((__position._M_current)->
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((__position._M_current)->
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ((__position._M_current)->
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ppvVar2 = &(__return_storage_ptr__->merkle_trees).
                   super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                   .
                   super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppvVar2 = *ppvVar2 + 1;
      }
      pvVar5 = (__return_storage_ptr__->merkle_trees).
               super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
               .
               super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      sVar37 = bdecode_node::string_value(&local_238);
      ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
      reserve(pvVar5 + -1,sVar37._M_len >> 5);
      local_1b0 = bdecode_node::string_value(&local_238);
      pbVar23 = (pointer)local_1b0._M_len;
      while (pbVar23 != (pointer)0x0) {
        ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>::
        emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                  ((vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> *)
                   ((__return_storage_ptr__->merkle_trees).
                    super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                    .
                    super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1),
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_1b0);
        if (local_1b0._M_len < (pointer)&DAT_00000020) {
          ::std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     0x20);
        }
        pbVar23 = (pointer)(local_1b0._M_len + -0x20);
        local_1b0._M_str = (char *)((long)local_1b0._M_str + 0x20);
        local_1b0._M_len = (size_t)pbVar23;
      }
      key_27._M_str = "verified";
      key_27._M_len = 8;
      bdecode_node::dict_find_string((bdecode_node *)&local_1b0,&local_288,key_27);
      bVar16 = bdecode_node::operator_cast_to_bool((bdecode_node *)&local_1b0);
      if (bVar16) {
        sVar37 = bdecode_node::string_value((bdecode_node *)&local_1b0);
        if (local_298 == 1) {
          local_130.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_130.m_tokens.
                                 super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,(int)sVar37._M_len)
          ;
          ::std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>::
          emplace_back<int>((vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_> *)
                            local_2a0,(int *)&local_130);
          if (sVar37._M_len != 0) {
            pbVar6 = (__return_storage_ptr__->verified_leaf_hashes).
                     super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                     super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            sVar29 = 0;
            do {
              if ((&((pointer)sVar37._M_str)->field_0x0)[sVar29] == '1') {
                uVar21 = 0x80000000 >> ((byte)sVar29 & 0x1f);
                iVar20 = (int)sVar29;
                iVar22 = iVar20 + 0x1f;
                if (-1 < iVar20) {
                  iVar22 = iVar20;
                }
                puVar4 = (uint *)((long)pbVar6[-1].m_buf.
                                        super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                                        ._M_t.
                                        super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                        .super__Head_base<0UL,_unsigned_int_*,_false> + 4 +
                                 (long)(iVar22 >> 5) * 4);
                *puVar4 = *puVar4 | uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 |
                                    (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
              }
              sVar29 = sVar29 + 1;
            } while (sVar37._M_len != sVar29);
          }
        }
        else {
          local_2e0.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)sVar37._M_len * 8;
          local_130.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)sVar37._M_str;
          ::std::vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>>::
          emplace_back<char_const*,int>(local_2a0,(char **)&local_130,(int *)&local_2e0);
        }
      }
      if ((pointer)local_1b0._M_len != (pointer)0x0) {
        operator_delete((void *)local_1b0._M_len,(long)local_1a0 - local_1b0._M_len);
      }
      key_28._M_str = "mask";
      key_28._M_len = 4;
      bdecode_node::dict_find_string((bdecode_node *)&local_1b0,&local_288,key_28);
      bVar16 = bdecode_node::operator_cast_to_bool((bdecode_node *)&local_1b0);
      if (bVar16) {
        sVar37 = bdecode_node::string_value((bdecode_node *)&local_1b0);
        if (local_298 == 1) {
          local_130.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_130.m_tokens.
                                 super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,(int)sVar37._M_len)
          ;
          ::std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>::
          emplace_back<int>((vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_> *)
                            local_240,(int *)&local_130);
          if (sVar37._M_len != 0) {
            pbVar6 = (__return_storage_ptr__->merkle_tree_mask).
                     super_vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>.
                     super__Vector_base<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            sVar29 = 0;
            do {
              if ((&((pointer)sVar37._M_str)->field_0x0)[sVar29] == '1') {
                uVar21 = 0x80000000 >> ((byte)sVar29 & 0x1f);
                iVar20 = (int)sVar29;
                iVar22 = iVar20 + 0x1f;
                if (-1 < iVar20) {
                  iVar22 = iVar20;
                }
                puVar4 = (uint *)((long)pbVar6[-1].m_buf.
                                        super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>
                                        ._M_t.
                                        super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                        .super__Head_base<0UL,_unsigned_int_*,_false> + 4 +
                                 (long)(iVar22 >> 5) * 4);
                *puVar4 = *puVar4 | uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 |
                                    (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
              }
              sVar29 = sVar29 + 1;
            } while (sVar37._M_len != sVar29);
          }
        }
        else {
          local_2e0.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)sVar37._M_len * 8;
          local_130.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)sVar37._M_str;
          ::std::vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>>::
          emplace_back<char_const*,int>(local_240,(char **)&local_130,(int *)&local_2e0);
        }
      }
      if ((pointer)local_1b0._M_len != (pointer)0x0) {
        operator_delete((void *)local_1b0._M_len,(long)local_1a0 - local_1b0._M_len);
      }
      pvVar13 = (void *)CONCAT44(local_238.m_tokens.
                                 super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)local_238.m_tokens.
                                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
      if (pvVar13 != (void *)0x0) {
        operator_delete(pvVar13,(long)local_238.m_tokens.
                                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pvVar13);
      }
      if (local_288.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_288.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_288.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_288.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  key_05._M_str = "total_uploaded";
  key_05._M_len = 0xe;
  iVar24 = bdecode_node::dict_find_int_value(rd,key_05,0);
  __return_storage_ptr__->total_uploaded = iVar24;
  key_06._M_str = "total_downloaded";
  key_06._M_len = 0x10;
  iVar24 = bdecode_node::dict_find_int_value(rd,key_06,0);
  __return_storage_ptr__->total_downloaded = iVar24;
  key_07._M_str = "active_time";
  key_07._M_len = 0xb;
  iVar24 = bdecode_node::dict_find_int_value(rd,key_07,0);
  __return_storage_ptr__->active_time = (int)iVar24;
  key_08._M_str = "finished_time";
  key_08._M_len = 0xd;
  iVar24 = bdecode_node::dict_find_int_value(rd,key_08,0);
  __return_storage_ptr__->finished_time = (int)iVar24;
  key_09._M_str = "seeding_time";
  key_09._M_len = 0xc;
  iVar24 = bdecode_node::dict_find_int_value(rd,key_09,0);
  __return_storage_ptr__->seeding_time = (int)iVar24;
  key_10._M_str = "last_seen_complete";
  key_10._M_len = 0x12;
  iVar24 = bdecode_node::dict_find_int_value(rd,key_10,0);
  __return_storage_ptr__->last_seen_complete = iVar24;
  key_11._M_str = "last_download";
  key_11._M_len = 0xd;
  iVar24 = bdecode_node::dict_find_int_value(rd,key_11,0);
  __return_storage_ptr__->last_download = iVar24;
  key_12._M_str = "last_upload";
  key_12._M_len = 0xb;
  iVar24 = bdecode_node::dict_find_int_value(rd,key_12,0);
  __return_storage_ptr__->last_upload = iVar24;
  key_13._M_str = "num_complete";
  key_13._M_len = 0xc;
  iVar24 = bdecode_node::dict_find_int_value(rd,key_13,-1);
  __return_storage_ptr__->num_complete = (int)iVar24;
  key_14._M_str = "num_incomplete";
  key_14._M_len = 0xe;
  iVar24 = bdecode_node::dict_find_int_value(rd,key_14,-1);
  __return_storage_ptr__->num_incomplete = (int)iVar24;
  key_15._M_str = "num_downloaded";
  key_15._M_len = 0xe;
  iVar24 = bdecode_node::dict_find_int_value(rd,key_15,-1);
  __return_storage_ptr__->num_downloaded = (int)iVar24;
  key_16._M_str = "max_uploads";
  key_16._M_len = 0xb;
  iVar24 = bdecode_node::dict_find_int_value(rd,key_16,-1);
  __return_storage_ptr__->max_uploads = (int)iVar24;
  key_17._M_str = "max_connections";
  key_17._M_len = 0xf;
  iVar24 = bdecode_node::dict_find_int_value(rd,key_17,-1);
  __return_storage_ptr__->max_connections = (int)iVar24;
  key_18._M_str = "upload_rate_limit";
  key_18._M_len = 0x11;
  iVar24 = bdecode_node::dict_find_int_value(rd,key_18,-1);
  __return_storage_ptr__->upload_limit = (int)iVar24;
  key_19._M_str = "download_rate_limit";
  key_19._M_len = 0x13;
  iVar24 = bdecode_node::dict_find_int_value(rd,key_19,-1);
  __return_storage_ptr__->download_limit = (int)iVar24;
  current_flags = &__return_storage_ptr__->flags;
  anon_unknown_27::apply_flag(current_flags,rd,"seed_mode",(torrent_flags_t)0x1);
  anon_unknown_27::apply_flag(current_flags,rd,"upload_mode",(torrent_flags_t)0x2);
  anon_unknown_27::apply_flag(current_flags,rd,"share_mode",(torrent_flags_t)0x4);
  anon_unknown_27::apply_flag(current_flags,rd,"apply_ip_filter",(torrent_flags_t)0x8);
  anon_unknown_27::apply_flag(current_flags,rd,"paused",(torrent_flags_t)0x10);
  anon_unknown_27::apply_flag(current_flags,rd,"auto_managed",(torrent_flags_t)0x20);
  anon_unknown_27::apply_flag(current_flags,rd,"super_seeding",(torrent_flags_t)0x100);
  anon_unknown_27::apply_flag(current_flags,rd,"i2p",(torrent_flags_t)0x1000000);
  anon_unknown_27::apply_flag(current_flags,rd,"sequential_download",(torrent_flags_t)0x200);
  anon_unknown_27::apply_flag(current_flags,rd,"stop_when_ready",(torrent_flags_t)0x400);
  anon_unknown_27::apply_flag(current_flags,rd,"disable_dht",(torrent_flags_t)0x80000);
  anon_unknown_27::apply_flag(current_flags,rd,"disable_lsd",(torrent_flags_t)0x100000);
  anon_unknown_27::apply_flag(current_flags,rd,"disable_pex",(torrent_flags_t)0x200000);
  key_20._M_str = "save_path";
  key_20._M_len = 9;
  local_2a0 = (vector<libtorrent::bitfield,std::allocator<libtorrent::bitfield>> *)current_flags;
  sVar37 = bdecode_node::dict_find_string_value(rd,key_20,(string_view)ZEXT816(0));
  ::std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->save_path,0,
             (char *)(__return_storage_ptr__->save_path)._M_string_length,(ulong)sVar37._M_str);
  key_29._M_str = "mapped_files";
  key_29._M_len = 0xc;
  bdecode_node::dict_find_list(&local_288,rd,key_29);
  bVar16 = bdecode_node::operator_cast_to_bool(&local_288);
  if (bVar16) {
    for (iVar19 = 0; iVar20 = bdecode_node::list_size(&local_288), iVar19 < iVar20;
        iVar19 = iVar19 + 1) {
      sVar37 = bdecode_node::list_string_value_at(&local_288,iVar19,(string_view)ZEXT816(0));
      if (sVar37._M_len != 0) {
        local_238.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar19;
        pmVar25 = ::std::
                  map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&(__return_storage_ptr__->renamed_files).
                                super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ,(key_type *)&local_238);
        ::std::__cxx11::string::_M_replace
                  ((ulong)pmVar25,0,(char *)pmVar25->_M_string_length,(ulong)sVar37._M_str);
      }
    }
  }
  key_21._M_str = "added_time";
  key_21._M_len = 10;
  iVar24 = bdecode_node::dict_find_int_value(rd,key_21,0);
  __return_storage_ptr__->added_time = iVar24;
  key_22._M_str = "completed_time";
  key_22._M_len = 0xe;
  iVar24 = bdecode_node::dict_find_int_value(rd,key_22,0);
  __return_storage_ptr__->completed_time = iVar24;
  key_30._M_str = "file_priority";
  key_30._M_len = 0xd;
  bdecode_node::dict_find_list(&local_238,rd,key_30);
  bVar16 = bdecode_node::operator_cast_to_bool(&local_238);
  if (bVar16) {
    uVar21 = bdecode_node::list_size(&local_238);
    this_00 = &__return_storage_ptr__->file_priorities;
    ::std::
    vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
    ::resize(this_00,(long)(int)uVar21,(value_type *)&default_priority);
    if (0 < (int)uVar21) {
      uVar32 = 0;
      do {
        iVar24 = bdecode_node::list_int_value_at(&local_238,(int)uVar32,4);
        bVar17 = (byte)iVar24;
        if (6 < bVar17) {
          bVar17 = 7;
        }
        (this_00->
        super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
        )._M_impl.super__Vector_impl_data._M_start[uVar32].m_val = bVar17;
        if ((this_00->
            super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
            )._M_impl.super__Vector_impl_data._M_start[uVar32].m_val == '\0') {
          local_2a0->field_0x0 = (byte)*(unsigned_long *)&local_2a0->field_0x0 & 0xfe;
        }
        uVar32 = uVar32 + 1;
      } while (uVar21 != uVar32);
    }
  }
  key_31._M_str = "trackers";
  key_31._M_len = 8;
  bdecode_node::dict_find_list((bdecode_node *)&local_1b0,rd,key_31);
  bVar16 = bdecode_node::operator_cast_to_bool((bdecode_node *)&local_1b0);
  if (bVar16) {
    pbVar1 = (byte *)((long)&(__return_storage_ptr__->flags).m_val + 1);
    *pbVar1 = *pbVar1 | 8;
    local_170[0]._0_4_ = 0;
    for (iVar19 = 0; iVar20 = bdecode_node::list_size((bdecode_node *)&local_1b0), iVar19 < iVar20;
        iVar19 = iVar19 + 1) {
      bdecode_node::list_at(&local_130,(bdecode_node *)&local_1b0,iVar19);
      bVar16 = bdecode_node::operator_cast_to_bool(&local_130);
      if ((bVar16) && (tVar18 = bdecode_node::type(&local_130), tVar18 == list_t)) {
        for (iVar20 = 0; iVar22 = bdecode_node::list_size(&local_130), iVar20 < iVar22;
            iVar20 = iVar20 + 1) {
          local_2e0.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._0_16_ =
               bdecode_node::list_string_value_at(&local_130,iVar20,(string_view)ZEXT816(0));
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &__return_storage_ptr__->trackers,
                     (basic_string_view<char,_std::char_traits<char>_> *)&local_2e0);
          __position_00._M_current =
               (__return_storage_ptr__->tracker_tiers).super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              (__return_storage_ptr__->tracker_tiers).super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&__return_storage_ptr__->tracker_tiers,
                       __position_00,(int *)local_170);
          }
          else {
            *__position_00._M_current = local_170[0]._0_4_;
            (__return_storage_ptr__->tracker_tiers).super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
          }
          bVar16 = aux::is_i2p_url((string *)
                                   ((__return_storage_ptr__->trackers).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -1));
          if (bVar16) {
            pbVar1 = (byte *)((long)&local_2a0->field_0x0 + 3);
            *pbVar1 = *pbVar1 | 1;
          }
        }
        local_170[0]._0_4_ = local_170[0]._0_4_ + 1;
      }
      if (local_130.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_130.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_130.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_130.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  key_32._M_str = "url-list";
  key_32._M_len = 8;
  bdecode_node::dict_find_list(&local_130,rd,key_32);
  bVar16 = bdecode_node::operator_cast_to_bool(&local_130);
  if (bVar16) {
    pbVar1 = (byte *)((long)&(__return_storage_ptr__->flags).m_val + 1);
    *pbVar1 = *pbVar1 | 0x10;
    for (iVar19 = 0; iVar20 = bdecode_node::list_size(&local_130), iVar19 < iVar20;
        iVar19 = iVar19 + 1) {
      local_2e0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._0_16_ =
           bdecode_node::list_string_value_at(&local_130,iVar19,(string_view)ZEXT816(0));
      if (local_2e0.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start != 0) {
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->url_seeds,
                   (basic_string_view<char,_std::char_traits<char>_> *)&local_2e0);
      }
    }
  }
  key_33._M_str = "pieces";
  key_33._M_len = 6;
  bdecode_node::dict_find_string(&local_2e0,rd,key_33);
  bVar16 = bdecode_node::operator_cast_to_bool(&local_2e0);
  if (bVar16) {
    if (local_298 == 2) {
      sVar37 = bdecode_node::string_value(&local_2e0);
      bitfield::assign(&(__return_storage_ptr__->have_pieces).super_bitfield,sVar37._M_str,
                       (int)sVar37._M_len << 3);
    }
    else if (local_298 == 1) {
      pcVar26 = bdecode_node::string_ptr(&local_2e0);
      iVar19 = bdecode_node::string_length(&local_2e0);
      bitfield::resize(&(__return_storage_ptr__->have_pieces).super_bitfield,iVar19);
      this_01 = &__return_storage_ptr__->verified_pieces;
      bitfield::resize(&this_01->super_bitfield,iVar19);
      _Var7._M_head_impl =
           *(uint **)&(this_01->super_bitfield).m_buf.
                      super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t
                      .super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
      tVar8.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
      super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
           (__return_storage_ptr__->have_pieces).super_bitfield.m_buf.
           super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
      uVar32 = 0;
      bVar16 = false;
      while( true ) {
        if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var7._M_head_impl ==
            (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
          lVar31 = 0;
        }
        else {
          lVar31 = (long)(int)*_Var7._M_head_impl;
        }
        if (lVar31 <= (long)uVar32) break;
        uVar21 = 0x80000000 >> ((byte)uVar32 & 0x1f);
        if ((pcVar26[uVar32] & 1U) == 0) {
          uVar21 = ~uVar21;
          puVar4 = (uint *)((long)tVar8.
                                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                  .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 4 +
                           (uVar32 >> 5 & 0x7ffffff) * 4);
          *puVar4 = *puVar4 & (uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                              uVar21 << 0x18);
        }
        else {
          puVar4 = (uint *)((long)tVar8.
                                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                  .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 4 +
                           (uVar32 >> 5 & 0x7ffffff) * 4);
          *puVar4 = *puVar4 | uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 |
                              uVar21 << 0x18;
        }
        uVar21 = 0x80000000 >> ((byte)uVar32 & 0x1f);
        if ((pcVar26[uVar32] & 2U) == 0) {
          uVar21 = ~uVar21;
          (_Var7._M_head_impl + 1)[uVar32 >> 5 & 0x7ffffff] =
               (_Var7._M_head_impl + 1)[uVar32 >> 5 & 0x7ffffff] &
               (uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18)
          ;
        }
        else {
          (_Var7._M_head_impl + 1)[uVar32 >> 5 & 0x7ffffff] =
               (_Var7._M_head_impl + 1)[uVar32 >> 5 & 0x7ffffff] |
               uVar21 >> 0x18 | (uVar21 & 0xff0000) >> 8 | (uVar21 & 0xff00) << 8 | uVar21 << 0x18;
          bVar16 = true;
        }
        uVar32 = uVar32 + 1;
      }
      if ((!bVar16) &&
         ((this_01->super_bitfield).m_buf.
          super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
          super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> =
               (_Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>)0x0,
         _Var7._M_head_impl != (uint *)0x0)) {
        operator_delete__(_Var7._M_head_impl);
      }
    }
  }
  if (local_2e0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  key_34._M_str = "verified";
  key_34._M_len = 8;
  bdecode_node::dict_find_string(&local_2e0,rd,key_34);
  bVar16 = bdecode_node::operator_cast_to_bool(&local_2e0);
  if (bVar16) {
    sVar37 = bdecode_node::string_value(&local_2e0);
    bitfield::assign(&(__return_storage_ptr__->verified_pieces).super_bitfield,sVar37._M_str,
                     (int)sVar37._M_len << 3);
  }
  if (local_2e0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  key_35._M_str = "piece_priority";
  key_35._M_len = 0xe;
  bdecode_node::dict_find_string(&local_2e0,rd,key_35);
  bVar16 = bdecode_node::operator_cast_to_bool(&local_2e0);
  if (bVar16) {
    pcVar26 = bdecode_node::string_ptr(&local_2e0);
    iVar19 = bdecode_node::string_length(&local_2e0);
    ::std::
    vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
    ::resize(&__return_storage_ptr__->piece_priorities,(long)iVar19);
    psVar27 = (__return_storage_ptr__->piece_priorities).
              super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->piece_priorities).
        super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar27) {
      uVar32 = 0;
      do {
        bVar17 = pcVar26[uVar32];
        if (6 < (byte)pcVar26[uVar32]) {
          bVar17 = 7;
        }
        psVar27[uVar32].m_val = bVar17;
        uVar32 = uVar32 + 1;
        psVar27 = (__return_storage_ptr__->piece_priorities).
                  super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar32 < (ulong)((long)(__return_storage_ptr__->piece_priorities).
                                      super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar27));
    }
  }
  if (local_2e0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  key_36._M_str = "peers";
  key_36._M_len = 5;
  bdecode_node::dict_find_string(&local_2e0,rd,key_36);
  bVar16 = bdecode_node::operator_cast_to_bool(&local_2e0);
  if (bVar16) {
    local_90.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)bdecode_node::string_ptr(&local_2e0);
    for (iVar19 = 5; iVar20 = bdecode_node::string_length(&local_2e0), iVar19 < iVar20;
        iVar19 = iVar19 + 6) {
      aux::read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                ((basic_endpoint<boost::asio::ip::tcp> *)&local_170[0].base,(aux *)&local_90,in);
      iVar9._M_current =
           (__return_storage_ptr__->peers).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (__return_storage_ptr__->peers).
          super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
        ::_M_realloc_insert<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                  ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                    *)&__return_storage_ptr__->peers,iVar9,
                   (basic_endpoint<boost::asio::ip::tcp> *)&local_170[0].base);
      }
      else {
        *(ulong *)((long)&((iVar9._M_current)->impl_).data_ + 0xc) =
             CONCAT44(local_170[0]._16_4_,local_170[0]._12_4_);
        *(ulong *)((long)&((iVar9._M_current)->impl_).data_ + 0x14) =
             CONCAT44(local_170[0].v6.sin6_scope_id,local_170[0]._20_4_);
        *(ulong *)&((iVar9._M_current)->impl_).data_ =
             CONCAT44(local_170[0].v6.sin6_flowinfo,local_170[0]._0_4_);
        *(ulong *)((long)&((iVar9._M_current)->impl_).data_ + 8) =
             CONCAT44(local_170[0]._12_4_,local_170[0]._8_4_);
        ppbVar3 = &(__return_storage_ptr__->peers).
                   super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar3 = *ppbVar3 + 1;
      }
    }
  }
  if (local_2e0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  key_37._M_str = "peers6";
  key_37._M_len = 6;
  bdecode_node::dict_find_string(&local_2e0,rd,key_37);
  bVar16 = bdecode_node::operator_cast_to_bool(&local_2e0);
  if (bVar16) {
    local_90.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)bdecode_node::string_ptr(&local_2e0);
    for (iVar19 = 0x11; iVar20 = bdecode_node::string_length(&local_2e0), iVar19 < iVar20;
        iVar19 = iVar19 + 0x12) {
      aux::read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                ((basic_endpoint<boost::asio::ip::tcp> *)&local_170[0].base,(aux *)&local_90,in_00);
      iVar9._M_current =
           (__return_storage_ptr__->peers).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (__return_storage_ptr__->peers).
          super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
        ::_M_realloc_insert<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                  ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                    *)&__return_storage_ptr__->peers,iVar9,
                   (basic_endpoint<boost::asio::ip::tcp> *)&local_170[0].base);
      }
      else {
        *(ulong *)((long)&((iVar9._M_current)->impl_).data_ + 0xc) =
             CONCAT44(local_170[0]._16_4_,local_170[0]._12_4_);
        *(ulong *)((long)&((iVar9._M_current)->impl_).data_ + 0x14) =
             CONCAT44(local_170[0].v6.sin6_scope_id,local_170[0]._20_4_);
        *(ulong *)&((iVar9._M_current)->impl_).data_ =
             CONCAT44(local_170[0].v6.sin6_flowinfo,local_170[0]._0_4_);
        *(ulong *)((long)&((iVar9._M_current)->impl_).data_ + 8) =
             CONCAT44(local_170[0]._12_4_,local_170[0]._8_4_);
        ppbVar3 = &(__return_storage_ptr__->peers).
                   super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar3 = *ppbVar3 + 1;
      }
    }
  }
  if (local_2e0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  key_38._M_str = "banned_peers";
  key_38._M_len = 0xc;
  bdecode_node::dict_find_string(&local_2e0,rd,key_38);
  bVar16 = bdecode_node::operator_cast_to_bool(&local_2e0);
  if (bVar16) {
    local_90.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)bdecode_node::string_ptr(&local_2e0);
    for (iVar19 = 6; iVar20 = bdecode_node::string_length(&local_2e0), iVar19 < iVar20;
        iVar19 = iVar19 + 6) {
      aux::read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                ((basic_endpoint<boost::asio::ip::tcp> *)&local_170[0].base,(aux *)&local_90,in_01);
      iVar9._M_current =
           (__return_storage_ptr__->banned_peers).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (__return_storage_ptr__->banned_peers).
          super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
        ::_M_realloc_insert<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                  ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                    *)&__return_storage_ptr__->banned_peers,iVar9,
                   (basic_endpoint<boost::asio::ip::tcp> *)&local_170[0].base);
      }
      else {
        *(ulong *)((long)&((iVar9._M_current)->impl_).data_ + 0xc) =
             CONCAT44(local_170[0]._16_4_,local_170[0]._12_4_);
        *(ulong *)((long)&((iVar9._M_current)->impl_).data_ + 0x14) =
             CONCAT44(local_170[0].v6.sin6_scope_id,local_170[0]._20_4_);
        *(ulong *)&((iVar9._M_current)->impl_).data_ =
             CONCAT44(local_170[0].v6.sin6_flowinfo,local_170[0]._0_4_);
        *(ulong *)((long)&((iVar9._M_current)->impl_).data_ + 8) =
             CONCAT44(local_170[0]._12_4_,local_170[0]._8_4_);
        ppbVar3 = &(__return_storage_ptr__->banned_peers).
                   super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar3 = *ppbVar3 + 1;
      }
    }
  }
  if (local_2e0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  key_39._M_str = "banned_peers6";
  key_39._M_len = 0xd;
  bdecode_node::dict_find_string(&local_2e0,rd,key_39);
  bVar16 = bdecode_node::operator_cast_to_bool(&local_2e0);
  if (bVar16) {
    local_90.m_tokens.
    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)bdecode_node::string_ptr(&local_2e0);
    for (iVar19 = 0x11; iVar20 = bdecode_node::string_length(&local_2e0), iVar19 < iVar20;
        iVar19 = iVar19 + 0x12) {
      aux::read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                ((basic_endpoint<boost::asio::ip::tcp> *)&local_170[0].base,(aux *)&local_90,in_02);
      iVar9._M_current =
           (__return_storage_ptr__->banned_peers).
           super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (__return_storage_ptr__->banned_peers).
          super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
        ::_M_realloc_insert<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>
                  ((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                    *)&__return_storage_ptr__->banned_peers,iVar9,
                   (basic_endpoint<boost::asio::ip::tcp> *)&local_170[0].base);
      }
      else {
        *(ulong *)((long)&((iVar9._M_current)->impl_).data_ + 0xc) =
             CONCAT44(local_170[0]._16_4_,local_170[0]._12_4_);
        *(ulong *)((long)&((iVar9._M_current)->impl_).data_ + 0x14) =
             CONCAT44(local_170[0].v6.sin6_scope_id,local_170[0]._20_4_);
        *(ulong *)&((iVar9._M_current)->impl_).data_ =
             CONCAT44(local_170[0].v6.sin6_flowinfo,local_170[0]._0_4_);
        *(ulong *)((long)&((iVar9._M_current)->impl_).data_ + 8) =
             CONCAT44(local_170[0]._12_4_,local_170[0]._8_4_);
        ppbVar3 = &(__return_storage_ptr__->banned_peers).
                   super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar3 = *ppbVar3 + 1;
      }
    }
  }
  if (local_2e0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  key_40._M_str = "unfinished";
  key_40._M_len = 10;
  bdecode_node::dict_find_list(&local_2e0,rd,key_40);
  bVar16 = bdecode_node::operator_cast_to_bool(&local_2e0);
  if (bVar16) {
    for (iVar19 = 0; iVar20 = bdecode_node::list_size(&local_2e0), iVar19 < iVar20;
        iVar19 = iVar19 + 1) {
      bdecode_node::list_at((bdecode_node *)&local_170[0].base,&local_2e0,iVar19);
      tVar18 = bdecode_node::type((bdecode_node *)&local_170[0].base);
      if (tVar18 == dict_t) {
        key_23._M_str = "piece";
        key_23._M_len = 5;
        iVar24 = bdecode_node::dict_find_int_value((bdecode_node *)&local_170[0].base,key_23,-1);
        local_28c.m_val = (int)iVar24;
        if (-1 < local_28c.m_val) {
          key_41._M_str = "bitmask";
          key_41._M_len = 7;
          bdecode_node::dict_find_string(&local_90,(bdecode_node *)&local_170[0].base,key_41);
          bVar16 = bdecode_node::operator_cast_to_bool(&local_90);
          if ((bVar16) && (iVar20 = bdecode_node::string_length(&local_90), iVar20 != 0)) {
            this_03 = ::std::
                      map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                      ::operator[](&(__return_storage_ptr__->unfinished_pieces).
                                    super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                                   ,&local_28c);
            pcVar26 = bdecode_node::string_ptr(&local_90);
            iVar20 = bdecode_node::string_length(&local_90);
            bitfield::assign(this_03,pcVar26,iVar20 << 3);
          }
          if (local_90.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_90.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_90.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_90.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      pvVar13 = (void *)CONCAT44(local_170[0].v6.sin6_flowinfo,local_170[0]._0_4_);
      if (pvVar13 != (void *)0x0) {
        operator_delete(pvVar13,CONCAT44(local_170[0]._20_4_,local_170[0]._16_4_) - (long)pvVar13);
      }
    }
  }
  if (local_2e0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pbVar1 = (byte *)((long)&local_2a0->field_0x0 + 1);
  *pbVar1 = *pbVar1 & 0xdf;
  if (local_130.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_130.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_1b0._M_len != (pointer)0x0) {
    operator_delete((void *)local_1b0._M_len,(long)local_1a0 - local_1b0._M_len);
  }
  pvVar13 = (void *)CONCAT44(local_238.m_tokens.
                             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             (int)local_238.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
  if (pvVar13 != (void *)0x0) {
    operator_delete(pvVar13,(long)local_238.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar13
                   );
  }
  if (local_288.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1f8.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT17(local_1f8.m_tokens.
                             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                             CONCAT16(local_1f8.m_tokens.
                                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_,
                                      CONCAT15(local_1f8.m_tokens.
                                               super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                               _5_1_,CONCAT14(local_1f8.m_tokens.
                                                                                                                            
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_1_,(uint)local_1f8.m_tokens.
                                                                                                                              
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )))) -
                    (long)local_1f8.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
    return __return_storage_ptr__;
  }
  operator_delete(local_f0.m_tokens.
                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (long)local_f0.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_f0.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

add_torrent_params read_resume_data(bdecode_node const& rd, error_code& ec
		, int const piece_limit)
	{
		add_torrent_params ret;
		if (rd.type() != bdecode_node::dict_t)
		{
			ec = errors::not_a_dictionary;
			return ret;
		}

		if (bdecode_node const alloc = rd.dict_find_string("allocation"))
		{
			ret.storage_mode = (alloc.string_value() == "allocate"
				|| alloc.string_value() == "full")
				? storage_mode_allocate : storage_mode_sparse;
		}

		if (rd.dict_find_string_value("file-format")
			!= "libtorrent resume file")
		{
			ec = errors::invalid_file_tag;
			return ret;
		}

		std::int64_t const file_version = rd.dict_find_int_value("file-version", 1);

		if (file_version != 1 && file_version != 2)
		{
			ec = errors::invalid_file_tag;
			return ret;
		}

		auto info_hash = rd.dict_find_string_value("info-hash");
		auto info_hash2 = rd.dict_find_string_value("info-hash2");
		if (info_hash.size() != std::size_t(sha1_hash::size())
			&& info_hash2.size() != std::size_t(sha256_hash::size()))
		{
			ec = errors::missing_info_hash;
			return ret;
		}

		ret.name = rd.dict_find_string_value("name");

		if (info_hash.size() == 20)
			ret.info_hashes.v1.assign(info_hash.data());
		if (info_hash2.size() == 32)
			ret.info_hashes.v2.assign(info_hash2.data());

		bdecode_node const info = rd.dict_find_dict("info");
		if (info)
		{
			// verify the info-hash of the metadata stored in the resume file matches
			// the torrent we're loading
			info_hash_t const resume_ih(hasher(info.data_section()).final()
				, hasher256(info.data_section()).final());

			// if url is set, the info_hash is not actually the info-hash of the
			// torrent, but the hash of the URL, until we have the full torrent
			// only require the info-hash to match if we actually passed in one
			if ((!ret.info_hashes.has_v1() || resume_ih.v1 == ret.info_hashes.v1)
				&& (!ret.info_hashes.has_v2() || resume_ih.v2 == ret.info_hashes.v2))
			{
				auto ti = std::make_shared<torrent_info>(resume_ih);

				error_code err;
				if (!ti->parse_info_section(info, err, piece_limit))
				{
					ec = err;
				}
				else
				{
					// time_t might be 32 bit if we're unlucky, but there isn't
					// much to do about it
					ti->internal_set_creation_date(static_cast<std::time_t>(
						rd.dict_find_int_value("creation date", 0)));
					ti->internal_set_creator(rd.dict_find_string_value("created by", ""));
					ti->internal_set_comment(rd.dict_find_string_value("comment", ""));
				}
				ret.ti = std::move(ti);
			}
			else
			{
				ec = errors::mismatching_info_hash;
			}
		}

#if TORRENT_ABI_VERSION < 3
		ret.info_hash = ret.info_hashes.get_best();
#endif

		bdecode_node const trees = rd.dict_find_list("trees");
		if (trees)
		{
			ret.merkle_trees.reserve(trees.list_size());
			ret.verified_leaf_hashes.reserve(trees.list_size());
			for (int i = 0; i < trees.list_size(); ++i)
			{
				auto de = trees.list_at(i);
				if (de.type() != bdecode_node::dict_t)
					break;
				auto dh = de.dict_find_string("hashes");
				if (!dh || dh.string_length() % 32 != 0) break;

				ret.merkle_trees.emplace_back();
				ret.merkle_trees.back().reserve(dh.string_value().size() / 32);
				for (auto hashes = dh.string_value();
					!hashes.empty(); hashes = hashes.substr(32))
				{
					ret.merkle_trees.back().emplace_back(hashes);
				}

				if (bdecode_node const verified = de.dict_find_string("verified"))
				{
					string_view const str = verified.string_value();
					if (file_version == 1)
					{
						ret.verified_leaf_hashes.emplace_back(int(str.size()));
						for (std::size_t j = 0; j < str.size(); ++j)
						{
							if (str[j] == '1')
								ret.verified_leaf_hashes.back().set_bit(int(j));
						}
					}
					else
					{
						ret.verified_leaf_hashes.emplace_back(str.data(), int(str.size()) * 8);
					}
				}

				if (bdecode_node const mask = de.dict_find_string("mask"))
				{
					string_view const str = mask.string_value();
					if (file_version == 1)
					{
						ret.merkle_tree_mask.emplace_back(int(str.size()));
						for (std::size_t j = 0; j < str.size(); ++j)
						{
							if (str[j] == '1')
								ret.merkle_tree_mask.back().set_bit(int(j));
						}
					}
					else
					{
						ret.merkle_tree_mask.emplace_back(str.data(), int(str.size()) * 8);
					}
				}
			}
		}

		ret.total_uploaded = rd.dict_find_int_value("total_uploaded");
		ret.total_downloaded = rd.dict_find_int_value("total_downloaded");

		ret.active_time = int(rd.dict_find_int_value("active_time"));
		ret.finished_time = int(rd.dict_find_int_value("finished_time"));
		ret.seeding_time = int(rd.dict_find_int_value("seeding_time"));

		ret.last_seen_complete = std::time_t(rd.dict_find_int_value("last_seen_complete"));

		ret.last_download = std::time_t(rd.dict_find_int_value("last_download", 0));
		ret.last_upload = std::time_t(rd.dict_find_int_value("last_upload", 0));

		// scrape data cache
		ret.num_complete = int(rd.dict_find_int_value("num_complete", -1));
		ret.num_incomplete = int(rd.dict_find_int_value("num_incomplete", -1));
		ret.num_downloaded = int(rd.dict_find_int_value("num_downloaded", -1));

		// torrent settings
		ret.max_uploads = int(rd.dict_find_int_value("max_uploads", -1));
		ret.max_connections = int(rd.dict_find_int_value("max_connections", -1));
		ret.upload_limit = int(rd.dict_find_int_value("upload_rate_limit", -1));
		ret.download_limit = int(rd.dict_find_int_value("download_rate_limit", -1));

		// torrent flags
		apply_flag(ret.flags, rd, "seed_mode", torrent_flags::seed_mode);
		apply_flag(ret.flags, rd, "upload_mode", torrent_flags::upload_mode);
#ifndef TORRENT_DISABLE_SHARE_MODE
		apply_flag(ret.flags, rd, "share_mode", torrent_flags::share_mode);
#endif
		apply_flag(ret.flags, rd, "apply_ip_filter", torrent_flags::apply_ip_filter);
		apply_flag(ret.flags, rd, "paused", torrent_flags::paused);
		apply_flag(ret.flags, rd, "auto_managed", torrent_flags::auto_managed);
#ifndef TORRENT_DISABLE_SUPERSEEDING
		apply_flag(ret.flags, rd, "super_seeding", torrent_flags::super_seeding);
#endif
#if TORRENT_USE_I2P
		apply_flag(ret.flags, rd, "i2p", torrent_flags::i2p_torrent);
#endif
		apply_flag(ret.flags, rd, "sequential_download", torrent_flags::sequential_download);
		apply_flag(ret.flags, rd, "stop_when_ready", torrent_flags::stop_when_ready);
		apply_flag(ret.flags, rd, "disable_dht", torrent_flags::disable_dht);
		apply_flag(ret.flags, rd, "disable_lsd", torrent_flags::disable_lsd);
		apply_flag(ret.flags, rd, "disable_pex", torrent_flags::disable_pex);

		ret.save_path = rd.dict_find_string_value("save_path");

#if TORRENT_ABI_VERSION == 1
		// deprecated in 1.2
		ret.url = rd.dict_find_string_value("url");
#endif

		bdecode_node const mapped_files = rd.dict_find_list("mapped_files");
		if (mapped_files)
		{
			for (int i = 0; i < mapped_files.list_size(); ++i)
			{
				auto new_filename = mapped_files.list_string_value_at(i);
				if (new_filename.empty()) continue;
				ret.renamed_files[file_index_t(i)] = new_filename;
			}
		}

		ret.added_time = std::time_t(rd.dict_find_int_value("added_time", 0));
		ret.completed_time = std::time_t(rd.dict_find_int_value("completed_time", 0));

		// load file priorities except if the add_torrent_param file was set to
		// override resume data
		bdecode_node const file_priority = rd.dict_find_list("file_priority");
		if (file_priority)
		{
			int const num_files = file_priority.list_size();
			ret.file_priorities.resize(aux::numeric_cast<std::size_t>(num_files)
				, default_priority);
			for (int i = 0; i < num_files; ++i)
			{
				auto const idx = static_cast<std::size_t>(i);
				ret.file_priorities[idx] = std::clamp(
					download_priority_t(static_cast<std::uint8_t>(
						file_priority.list_int_value_at(i
							, static_cast<std::uint8_t>(default_priority))))
						, dont_download, top_priority);
				// this is suspicious, leave seed mode
				if (ret.file_priorities[idx] == dont_download)
				{
					ret.flags &= ~torrent_flags::seed_mode;
				}
			}
		}

		bdecode_node const trackers = rd.dict_find_list("trackers");
		if (trackers)
		{
			// it's possible to delete the trackers from a torrent and then save
			// resume data with an empty trackers list. Since we found a trackers
			// list here, these should replace whatever we find in the .torrent
			// file.
			ret.flags |= torrent_flags::deprecated_override_trackers;

			int tier = 0;
			for (int i = 0; i < trackers.list_size(); ++i)
			{
				bdecode_node const tier_list = trackers.list_at(i);
				if (!tier_list || tier_list.type() != bdecode_node::list_t)
					continue;

				for (int j = 0; j < tier_list.list_size(); ++j)
				{
					ret.trackers.emplace_back(tier_list.list_string_value_at(j));
					ret.tracker_tiers.push_back(tier);
#if TORRENT_USE_I2P
					if (aux::is_i2p_url(ret.trackers.back())) ret.flags |= torrent_flags::i2p_torrent;
#endif
				}
				++tier;
			}
		}

		// if merge resume http seeds is not set, we need to clear whatever web
		// seeds we loaded from the .torrent file, because we want whatever's in
		// the resume file to take precedence. If there aren't even any fields in
		// the resume data though, keep the ones from the torrent
		bdecode_node const url_list = rd.dict_find_list("url-list");
		if (url_list)
		{
			// since we found http seeds in the resume data, they should replace
			// whatever web seeds are specified in the .torrent, by default
			ret.flags |= torrent_flags::deprecated_override_web_seeds;
			for (int i = 0; i < url_list.list_size(); ++i)
			{
				auto url = url_list.list_string_value_at(i);
				if (url.empty()) continue;
				ret.url_seeds.emplace_back(url);
			}
		}

		// some sanity checking. Maybe we shouldn't be in seed mode anymore
		if (bdecode_node const pieces = rd.dict_find_string("pieces"))
		{
			if (file_version == 1)
			{
				char const* pieces_str = pieces.string_ptr();
				int const pieces_len = pieces.string_length();
				ret.have_pieces.resize(pieces_len);
				ret.verified_pieces.resize(pieces_len);
				bool any_verified = false;
				for (piece_index_t i(0); i < ret.verified_pieces.end_index(); ++i)
				{
					// being in seed mode and missing a piece is not compatible.
					// Leave seed mode if that happens
					if (pieces_str[static_cast<int>(i)] & 1) ret.have_pieces.set_bit(i);
					else ret.have_pieces.clear_bit(i);

					if (pieces_str[static_cast<int>(i)] & 2)
					{
						ret.verified_pieces.set_bit(i);
						any_verified = true;
					}
					else
					{
						ret.verified_pieces.clear_bit(i);
					}
				}
				if (!any_verified) ret.verified_pieces.clear();
			}
			else if (file_version == 2)
			{
				string_view const str = pieces.string_value();
				ret.have_pieces.assign(str.data(), int(str.size()) * 8);
			}
		}

		if (bdecode_node const verified = rd.dict_find_string("verified"))
		{
			string_view const str = verified.string_value();
			ret.verified_pieces.assign(str.data(), int(str.size()) * 8);
		}

		if (bdecode_node const piece_priority = rd.dict_find_string("piece_priority"))
		{
			char const* prio_str = piece_priority.string_ptr();
			ret.piece_priorities.resize(aux::numeric_cast<std::size_t>(piece_priority.string_length()));
			for (std::size_t i = 0; i < ret.piece_priorities.size(); ++i)
			{
				ret.piece_priorities[i] = download_priority_t(std::clamp(
					static_cast<std::uint8_t>(prio_str[i])
					, static_cast<std::uint8_t>(dont_download)
					, static_cast<std::uint8_t>(top_priority)));
			}
		}

		int const v6_size = 18;
		int const v4_size = 6;
		using namespace libtorrent::aux; // for read_*_endpoint()
		if (bdecode_node const peers_entry = rd.dict_find_string("peers"))
		{
			char const* ptr = peers_entry.string_ptr();
			for (int i = v4_size - 1; i < peers_entry.string_length(); i += v4_size)
				ret.peers.push_back(read_v4_endpoint<tcp::endpoint>(ptr));
		}

		if (bdecode_node const peers_entry = rd.dict_find_string("peers6"))
		{
			char const* ptr = peers_entry.string_ptr();
			for (int i = v6_size - 1; i < peers_entry.string_length(); i += v6_size)
				ret.peers.push_back(read_v6_endpoint<tcp::endpoint>(ptr));
		}

		if (bdecode_node const peers_entry = rd.dict_find_string("banned_peers"))
		{
			char const* ptr = peers_entry.string_ptr();
			for (int i = v4_size; i < peers_entry.string_length(); i += v4_size)
				ret.banned_peers.push_back(read_v4_endpoint<tcp::endpoint>(ptr));
		}

		if (bdecode_node const peers_entry = rd.dict_find_string("banned_peers6"))
		{
			char const* ptr = peers_entry.string_ptr();
			for (int i = v6_size - 1; i < peers_entry.string_length(); i += v6_size)
				ret.banned_peers.push_back(read_v6_endpoint<tcp::endpoint>(ptr));
		}

		// parse unfinished pieces
		if (bdecode_node const unfinished_entry = rd.dict_find_list("unfinished"))
		{
			for (int i = 0; i < unfinished_entry.list_size(); ++i)
			{
				bdecode_node const e = unfinished_entry.list_at(i);
				if (e.type() != bdecode_node::dict_t) continue;
				piece_index_t const piece = piece_index_t(int(e.dict_find_int_value("piece", -1)));
				if (piece < piece_index_t(0)) continue;

				bdecode_node const bitmask = e.dict_find_string("bitmask");
				if (!bitmask || bitmask.string_length() == 0) continue;
				ret.unfinished_pieces[piece].assign(
					bitmask.string_ptr(), bitmask.string_length() * CHAR_BIT);
			}
		}

		// we're loading this torrent from resume data. There's no need to
		// re-save the resume data immediately.
		ret.flags &= ~torrent_flags::need_save_resume;

		return ret;
	}